

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::WriteObjectUserData(ON_BinaryArchive *this,ON_Object *object)

{
  ON_UserDataItemFilter *pOVar1;
  ON_Object *pOVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined7 extraout_var;
  ON_UserData *this_00;
  ON_ClassId *pOVar8;
  char *pcVar9;
  ON_UnknownUserData *pOVar10;
  ON_3DM_BIG_CHUNK *pOVar11;
  ulong uVar12;
  uint *puVar13;
  char cVar14;
  long lVar15;
  char cVar16;
  undefined8 unaff_R12;
  ON_UserData *p;
  int *piVar17;
  ON_UUID local_98;
  uint local_84;
  ON_ClassId *local_80;
  ON_Object *local_78;
  ON_UUID local_70;
  int *local_60;
  undefined4 local_54;
  ON_UnknownUserData *local_50;
  ON_UUID *local_48;
  uint *local_40;
  ON_SimpleArray<ON_UUID_struct> *local_38;
  undefined4 extraout_var_00;
  
  if (this->m_3dm_version < 3) {
    return true;
  }
  uVar12 = (ulong)(uint)(this->m_user_data_filter).m_count;
  local_78 = object;
  if (uVar12 != 0) {
    pOVar1 = (this->m_user_data_filter).m_a;
    lVar15 = 0;
    do {
      if (*(char *)((long)(&pOVar1->m_item_id + 1) + lVar15 + 4) == '\0') {
        lVar15 = 0;
        goto LAB_0039a657;
      }
      lVar15 = lVar15 + 0x28;
    } while (uVar12 * 0x28 != lVar15);
  }
  cVar14 = '\0';
  local_54 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  local_84 = 0;
  goto LAB_0039a683;
  while (bVar3 = uVar12 * 0x28 + -0x28 != lVar15, lVar15 = lVar15 + 0x28, bVar3) {
LAB_0039a657:
    cVar14 = *(char *)((long)(&pOVar1->m_item_id + 1) + lVar15 + 4);
    if (cVar14 != '\0') break;
  }
  bVar3 = ObjectHasUserDataToWrite(this,object);
  local_84 = (uint)CONCAT71(extraout_var,bVar3) ^ 1;
  local_54 = 0;
LAB_0039a683:
  this_00 = ON_Object::FirstUserData(local_78);
  if (this_00 == (ON_UserData *)0x0) {
    return true;
  }
  local_60 = &this->m_3dm_version;
  local_38 = &this->m_V3_plugin_id_list;
  cVar16 = (char)local_54;
  local_40 = &this->m_3dm_opennurbs_version;
  p = (ON_UserData *)0x0;
  do {
    pOVar2 = local_78;
    if (((p != (ON_UserData *)0x0) && (p->m_userdata_next == this_00)) &&
       (bVar3 = ON_Object::DetachUserData(local_78,p), bVar3)) {
      (*(p->super_ON_Object)._vptr_ON_Object[4])(p);
    }
    iVar6 = (*(this_00->super_ON_Object)._vptr_ON_Object[0x1b])(this_00,this,pOVar2);
    p = (ON_UserData *)0x0;
    if ((char)iVar6 != '\0') {
      p = this_00;
    }
    bVar3 = true;
    if (((char)local_84 == '\0') &&
       (iVar6 = (*(this_00->super_ON_Object)._vptr_ON_Object[0x1a])(this_00,this,pOVar2),
       (char)iVar6 != '\0')) {
      iVar6 = ON_UuidCompare(&this_00->m_userdata_uuid,&ON_nil_uuid);
      if ((iVar6 != 0) && (this_00->m_userdata_owner == local_78)) {
        iVar6 = (**(this_00->super_ON_Object)._vptr_ON_Object)(this_00);
        pOVar8 = (ON_ClassId *)CONCAT44(extraout_var_00,iVar6);
        if (((pOVar8 != &ON_Object::m_ON_Object_class_rtti) && (pOVar8 != (ON_ClassId *)0x0)) &&
           (pOVar8 != &ON_UserData::m_ON_UserData_class_rtti)) {
          local_80 = pOVar8;
          local_70 = ON_UserData::UserDataClassUuid(this_00);
          iVar6 = ON_UuidCompare(&local_70,&ON_nil_uuid);
          if (iVar6 != 0) {
            local_48 = &this_00->m_userdata_uuid;
            local_98 = ON_ClassId::Uuid(&ON_UserData::m_ON_UserData_class_rtti);
            iVar6 = ON_UuidCompare(&local_70,&local_98);
            if (iVar6 != 0) {
              local_98 = ON_ClassId::Uuid(&ON_Object::m_ON_Object_class_rtti);
              iVar6 = ON_UuidCompare(&local_70,&local_98);
              if (iVar6 != 0) {
                local_98 = ON_ClassId::Uuid(&ON_UnknownUserData::m_ON_UnknownUserData_class_rtti);
                iVar6 = ON_UuidCompare(&local_70,&local_98);
                if (iVar6 != 0) {
                  local_98 = ON_ClassId::Uuid(&ON_ObsoleteUserData::m_ON_ObsoleteUserData_class_rtti
                                             );
                  iVar6 = ON_UuidCompare(&local_70,&local_98);
                  if (((iVar6 != 0) &&
                      ((*local_60 != 3 ||
                       (iVar6 = ON_SimpleArray<ON_UUID_struct>::BinarySearch
                                          (local_38,&this_00->m_application_uuid,ON_UuidCompare),
                       -1 < iVar6)))) &&
                     (((char)local_54 != '\0' ||
                      (bVar5 = ShouldSerializeUserDataItem
                                         (this,this_00->m_application_uuid,this_00->m_userdata_uuid)
                      , bVar5)))) {
                    bVar5 = ON_UuidIsNil(&this_00->m_application_uuid);
                    if (bVar5) {
                      pcVar9 = ON_ClassId::ClassName(local_80);
                      ON_Error("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                               ,0x130f,"Not saving %s userdata - m_application_uuid is nil.",pcVar9)
                      ;
                    }
                    else {
                      local_80 = (ON_ClassId *)&this_00->m_application_uuid;
                      pOVar10 = ON_UnknownUserData::Cast(&this_00->super_ON_Object);
                      bVar5 = ON_UserData::IsUnknownUserData(this_00);
                      if (pOVar10 == (ON_UnknownUserData *)0x0) {
                        if (bVar5) {
                          iVar6 = 0x131a;
                          pcVar9 = 
                          "ON_UnknownUserData::Cast(ud) is null and ud->IsUnknownUserData() is true."
                          ;
                          goto LAB_0039a9cc;
                        }
LAB_0039a9d8:
                        bVar3 = false;
                        local_50 = pOVar10;
                        bVar5 = BeginWrite3dmBigChunk(this,0x27ffd,0);
                        if (!bVar5) {
LAB_0039ac2a:
                          if (p == (ON_UserData *)0x0) {
                            return bVar3;
                          }
                          if (p->m_userdata_next != (ON_UserData *)0x0) {
                            return bVar3;
                          }
                          bVar5 = ON_Object::DetachUserData(local_78,p);
                          if (!bVar5) {
                            return bVar3;
                          }
                          (*(p->super_ON_Object)._vptr_ON_Object[4])(p);
                          return bVar3;
                        }
                        local_98.Data1._0_1_ = 0x22;
                        Write(this,1,&local_98);
                        bVar4 = 0;
                        bVar3 = BeginWrite3dmBigChunk(this,0x2fff9,0);
                        if (bVar3) {
                          bVar3 = WriteUuid(this,&local_70);
                          if ((bVar3) && (bVar3 = WriteUuid(this,local_48), bVar3)) {
                            local_98.Data1 = this_00->m_userdata_copycount;
                            bVar3 = WriteInt32(this,1,(ON__INT32 *)&local_98);
                            if ((bVar3) &&
                               ((bVar3 = WriteDouble(this,0x10,(double *)&this_00->m_userdata_xform)
                                , bVar3 && (bVar3 = WriteUuid(this,(ON_UUID *)local_80), bVar3)))) {
                              puVar13 = &local_50->m_3dm_opennurbs_version_number;
                              if (local_50 == (ON_UnknownUserData *)0x0) {
                                puVar13 = local_40;
                              }
                              piVar17 = &local_50->m_3dm_version;
                              if (local_50 == (ON_UnknownUserData *)0x0) {
                                piVar17 = local_60;
                              }
                              WriteBool(this,local_50 != (ON_UnknownUserData *)0x0);
                              uVar7 = *piVar17;
                              local_98.Data1 = uVar7;
                              bVar3 = WriteInt32(this,1,(ON__INT32 *)&local_98);
                              local_80 = (ON_ClassId *)CONCAT71(local_80._1_7_,bVar3);
                              uVar7 = ArchiveOpenNURBSVersionToWrite(uVar7,*puVar13);
                              if ((char)local_80 != '\0') {
                                local_98.Data1 = uVar7;
                                bVar3 = WriteInt32(this,1,(ON__INT32 *)&local_98);
                                bVar5 = EndWrite3dmChunk(this);
                                bVar4 = 0;
                                if ((bVar5 && bVar3) &&
                                   (bVar3 = BeginWrite3dmBigChunk(this,0x40008000,0), bVar3)) {
                                  if (local_50 != (ON_UnknownUserData *)0x0) {
                                    lVar15 = (long)(this->m_chunk).m_count;
                                    pOVar11 = (this->m_chunk).m_a + lVar15 + -1;
                                    if (lVar15 < 1) {
                                      pOVar11 = (ON_3DM_BIG_CHUNK *)0x0;
                                    }
                                    pOVar11->m_do_crc16 = '\0';
                                    pOVar11 = (this->m_chunk).m_a + lVar15 + -1;
                                    if (lVar15 < 1) {
                                      pOVar11 = (ON_3DM_BIG_CHUNK *)0x0;
                                    }
                                    pOVar11->m_do_crc32 = '\0';
                                    this->m_bDoChunkCRC = false;
                                  }
                                  iVar6 = this->m_user_data_depth;
                                  if (iVar6 < 0) {
                                    iVar6 = 0;
                                    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                                               ,0x137d,"","m_user_data_depth < 0");
                                  }
                                  this->m_user_data_depth = iVar6 + 1;
                                  iVar6 = (*(this_00->super_ON_Object)._vptr_ON_Object[10])
                                                    (this_00,this);
                                  this->m_user_data_depth = this->m_user_data_depth + -1;
                                  bVar3 = EndWrite3dmChunk(this);
                                  bVar4 = bVar3 & (byte)iVar6;
                                }
                                goto LAB_0039ac10;
                              }
                            }
                          }
                          EndWrite3dmChunk(this);
                          bVar4 = 0;
                        }
LAB_0039ac10:
                        bVar3 = EndWrite3dmChunk(this);
                        bVar3 = (bool)(bVar3 & bVar4);
                      }
                      else if (bVar5) {
                        if ((((cVar14 != '\0' || cVar16 != '\0') &&
                             (uVar7 = pOVar10->m_3dm_version, 0x2b < uVar7 - 6 && 3 < (int)uVar7))
                            && (0xbf67451 < pOVar10->m_3dm_opennurbs_version_number)) &&
                           ((uVar7 < 0x32 || (0x31 < *local_60)))) goto LAB_0039a9d8;
                      }
                      else {
                        iVar6 = 0x1322;
                        pcVar9 = 
                        "ON_UnknownUserData::Cast(ud) is not null and ud->IsUnknownUserData() is false."
                        ;
LAB_0039a9cc:
                        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                                   ,iVar6,"",pcVar9);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    this_00 = this_00->m_userdata_next;
    if ((this_00 == (ON_UserData *)0x0) || (bVar3 == false)) goto LAB_0039ac2a;
  } while( true );
}

Assistant:

bool ON_BinaryArchive::WriteObjectUserData( const ON_Object& object )
{
  if ( m_3dm_version < 3 )
  {
    // no user data is saved in V1 and V2 files.
    return true;
  }

  const bool bSaveAllUserData = ShouldSerializeAllUserData();
  const bool bSaveSelectedUserData = bSaveAllUserData ? false : ShouldSerializeSomeUserData();
  const bool bHasWritableUserData = (bSaveAllUserData || ObjectHasUserDataToWrite(&object));

  // writes user data attached to object.
  bool rc = true;
  const ON_UserData* ud;
  ON_UUID userdata_classid;

  ON_UserData* delete_this_ud = 0;
  
  for (ud = object.FirstUserData(); ud && rc; ud = ud->m_userdata_next) 
  {
    if (0 != delete_this_ud)
    {
      if (delete_this_ud->m_userdata_next == ud)
      {
        if (const_cast<ON_Object&>(object).DetachUserData(delete_this_ud))
          delete delete_this_ud;
      }
      delete_this_ud = 0;
    }

    if (ud->DeleteAfterWrite(*this,&object))
      delete_this_ud = const_cast< ON_UserData* >(ud);

    if (false == bHasWritableUserData)
      continue;

    if (!ud->WriteToArchive(*this,&object))
      continue;

    // LOTS of tests to weed out bogus user data
    if ( 0 == ON_UuidCompare( ud->m_userdata_uuid, ON_nil_uuid ) )
      continue;
    if ( &object != ud->m_userdata_owner )
      continue;
    const ON_ClassId* cid = ud->ClassId();
    if ( 0 == cid )
      continue;
    if ( cid == &ON_CLASS_RTTI(ON_UserData) )
      continue;
    if ( cid == &ON_CLASS_RTTI(ON_Object) )
      continue;

    // The UserDataClassUuid() function is used instead of 
    // calling cid->Uuid() so we get the value of the 
    // plug-in's class id when the plug-in is not loaded
    // and ud is ON_UnknownUserData.
    userdata_classid = ud->UserDataClassUuid();
    if ( 0 == ON_UuidCompare( userdata_classid, ON_nil_uuid ) )
      continue;
    if ( 0 == ON_UuidCompare( userdata_classid, ON_CLASS_ID(ON_UserData) ) )
      continue;
    if ( 0 == ON_UuidCompare( userdata_classid, ON_CLASS_ID(ON_Object) ) )
      continue;
    if (0 == ON_UuidCompare(userdata_classid, ON_CLASS_ID(ON_UnknownUserData)))
      continue;
    if (0 == ON_UuidCompare(userdata_classid, ON_CLASS_ID(ON_ObsoleteUserData)))
      continue;

    if ( 3 == m_3dm_version )
    {
      // When saving a V3 archive and the user data is not
      // native V3 data, make sure the plug-in supports
      // writing V3 user data.
      if ( m_V3_plugin_id_list.BinarySearch( &ud->m_application_uuid, ON_UuidCompare ) < 0 )
        continue;
    }

    if (false == bSaveAllUserData 
        && false == ShouldSerializeUserDataItem(ud->m_application_uuid, ud->m_userdata_uuid)
       )
      continue;

    if ( ON_UuidIsNil( ud->m_application_uuid ) )
    {
      // As of version 200909190 - a non-nil application_uuid is 
      // required in order for user data to be saved in a 
      // 3dm archive.
      ON_Error(__FILE__,__LINE__,"Not saving %s userdata - m_application_uuid is nil.",cid->ClassName());
      continue; 
    }

    // See if we have unknown user data (goo) and make sure
    // IsUnknownUserData() agrees with ON_UnknownUserData::Cast().
    const ON_UnknownUserData* unknown_ud = ON_UnknownUserData::Cast(ud);
    if ( 0 == unknown_ud )
    {
      if ( ud->IsUnknownUserData() )
      {
        ON_ERROR("ON_UnknownUserData::Cast(ud) is null and ud->IsUnknownUserData() is true.");
        continue; // something's wrong
      }
    }
    else
    {
      if ( !ud->IsUnknownUserData() )
      {
        ON_ERROR("ON_UnknownUserData::Cast(ud) is not null and ud->IsUnknownUserData() is false.");
        continue; // something's wrong
      }
    }

    if ( 0 != unknown_ud )
    {
      if (false == bSaveAllUserData && false == bSaveSelectedUserData)
        continue; // unknown user data cannot be critical

      if ( unknown_ud->m_3dm_version <= 3 )
        continue; // Unknown will not be resaved in V3 archives

      if ( unknown_ud->m_3dm_version > 5 && unknown_ud->m_3dm_version < 50 )
        continue;

      if ( unknown_ud->m_3dm_opennurbs_version_number < 200701010 )
        continue;

      if ( unknown_ud->m_3dm_version >= 50 && m_3dm_version < 50 )
      {
        // Unknown userdata with 8 byte chunk lengths cannot be
        // saved into a V4 file with 4 byte chunk lengths because
        // the resulting chunk will be unreadable in V4.
        // This is not an error condition.  It is a consequence
        // of V4 IO code not being robust enough to handle
        // 8 bytes chunk lengths.
        continue;
      }
    }

    // Each piece of user data is inside of 
    // a TCODE_OPENNURBS_CLASS_USERDATA chunk.
    rc = BeginWrite3dmChunk( TCODE_OPENNURBS_CLASS_USERDATA, 0 );
    if (rc) {
      rc = Write3dmChunkVersion(2,2);
      // wrap user data header info in an TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk
      rc = BeginWrite3dmChunk( TCODE_OPENNURBS_CLASS_USERDATA_HEADER, 0 );
      if (rc) 
      {
        if ( rc ) rc = WriteUuid( userdata_classid );
        if ( rc ) rc = WriteUuid( ud->m_userdata_uuid );
        if ( rc ) rc = WriteInt( ud->m_userdata_copycount );
        if ( rc ) rc = WriteXform( ud->m_userdata_xform );

        // added for version 2.1
        if ( rc ) rc = WriteUuid( ud->m_application_uuid );

        // added for version 2.2 - 14, October 2009
        if ( rc )
        {
          rc = WriteBool( unknown_ud ? true : false );
          // ver = 2,3,4,50,60,...
          const int file_format_ver = unknown_ud ? unknown_ud->m_3dm_version : m_3dm_version;
          rc = WriteInt(file_format_ver);
          // ver = opennurbs version number
          unsigned int app_ver = unknown_ud ? unknown_ud->m_3dm_opennurbs_version_number : m_3dm_opennurbs_version;
          unsigned int app_ver_to_write = ON_BinaryArchive::ArchiveOpenNURBSVersionToWrite(file_format_ver, app_ver);
          if (rc) rc = WriteInt(app_ver_to_write);
        }

        if ( !EndWrite3dmChunk() )
          rc = false;
      }
      if (rc) 
      {
        // wrap user data in an anonymous chunk
        rc = BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
        if ( rc ) 
        {
          if ( 0 != unknown_ud )
          {
            // 22 January 2004 Dale Lear
            //   Disable crc checking when writing the
            //   unknow user data block.
            //   This has to be done so we don't get an extra
            //   32 bit CRC calculated on the block that
            //   ON_UnknownUserData::Write() writes.  The
            //   original 32 bit crc is at the end of this
            //   block and will be checked when the class
            //   that wrote this user data is present.
            //   The EndWrite3dmChunk() will reset the
            //   CRC checking flags to the appropriate
            //   values.
            m_chunk.Last()->m_do_crc16 = 0;
            m_chunk.Last()->m_do_crc32 = 0;
            m_bDoChunkCRC = false;
          }

          if (m_user_data_depth < 0)
          {
            ON_ERROR("m_user_data_depth < 0");
            m_user_data_depth = 0;
          }
          m_user_data_depth++;
          rc = ud->Write(*this)?true:false;
          m_user_data_depth--;
          if ( !EndWrite3dmChunk() )
            rc = false;
        }
      }
      if ( !EndWrite3dmChunk() )
        rc = false;
    }
  }


  if (0 != delete_this_ud)
  {
    if (0 == delete_this_ud->m_userdata_next)
    {
      if (const_cast<ON_Object&>(object).DetachUserData(delete_this_ud))
        delete delete_this_ud;
    }
    delete_this_ud = 0;
  }

  return rc;
}